

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::insert_simplex_and_subfaces<int[2]>
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,int (*Nsimplex) [2],
          Filtration_value *filtration)

{
  int iVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  Filtration_value *pFVar5;
  int *piVar6;
  undefined8 *puVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  Filtration_value *pFVar9;
  const_iterator __cbeg;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last;
  Filtration_value *filt;
  long *in_FS_OFFSET;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
  pVar10;
  
  if ((char)in_FS_OFFSET[-0x19] == '\0') {
    insert_simplex_and_subfaces<int[2]>();
  }
  lVar2 = in_FS_OFFSET[-0x1c];
  if (in_FS_OFFSET[-0x1b] != lVar2) {
    in_FS_OFFSET[-0x1b] = lVar2;
  }
  std::vector<int,std::allocator<int>>::_M_range_insert<int_const*>
            ((vector<int,std::allocator<int>> *)(*in_FS_OFFSET + -0xe0),lVar2,filtration,
             filtration + 1);
  last._M_current = (int *)in_FS_OFFSET[-0x1c];
  filt = (Filtration_value *)in_FS_OFFSET[-0x1b];
  if ((Filtration_value *)last._M_current != filt) {
    uVar4 = (long)filt - (long)last._M_current >> 2;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (last._M_current,filt,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (last._M_current,filt);
    last._M_current = (int *)in_FS_OFFSET[-0x1c];
    filt = (Filtration_value *)in_FS_OFFSET[-0x1b];
  }
  if ((Filtration_value *)last._M_current != filt) {
    pFVar9 = (Filtration_value *)(last._M_current + 1);
    do {
      pFVar5 = pFVar9;
      if (pFVar5 == filt) goto LAB_0010bb7a;
      pFVar9 = (Filtration_value *)((long)pFVar5 + 4);
    } while (*(int *)((long)pFVar5 + -4) != *(int *)pFVar5);
    piVar6 = (int *)((long)pFVar5 + -4);
    iVar3 = *(int *)((long)pFVar5 + -4);
    for (; pFVar9 != filt; pFVar9 = (Filtration_value *)((long)pFVar9 + 4)) {
      iVar1 = *(int *)pFVar9;
      if (iVar3 != iVar1) {
        piVar6[1] = iVar1;
        piVar6 = piVar6 + 1;
      }
      iVar3 = iVar1;
    }
    pFVar9 = (Filtration_value *)(piVar6 + 1);
    if (pFVar9 != filt) {
      in_FS_OFFSET[-0x1b] = (long)pFVar9;
      filt = pFVar9;
    }
  }
LAB_0010bb7a:
  if ((Filtration_value *)last._M_current != filt) {
    _Var8._M_current = last._M_current;
    do {
      if (*_Var8._M_current == Nsimplex[7][0]) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar7 = "cannot use the dummy null_vertex() as a real vertex";
        __cxa_throw(puVar7,&char_const*::typeinfo,0);
      }
      _Var8._M_current = _Var8._M_current + 4;
    } while ((Filtration_value *)_Var8._M_current != filt);
  }
  iVar3 = (int)((ulong)((long)filt - (long)last._M_current) >> 2) + -1;
  if (iVar3 < Nsimplex[0x10][0]) {
    iVar3 = Nsimplex[0x10][0];
  }
  Nsimplex[0x10][0] = iVar3;
  pVar10 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                     (this,(Siblings *)Nsimplex,
                      (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      (Nsimplex + 8),last,filt);
  pVar10.first.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)this;
  return pVar10;
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_and_subfaces(
      const InputVertexRange& Nsimplex,
      const Filtration_value& filtration = Filtration_value())
  {
    auto first = std::begin(Nsimplex);
    auto last = std::end(Nsimplex);

    if (first == last)
      return { null_simplex(), true }; // FIXME: false would make more sense to me.

    thread_local std::vector<Vertex_handle> copy;
    copy.clear();
    copy.insert(copy.end(), first, last);
    std::sort(copy.begin(), copy.end());
    auto last_unique = std::unique(copy.begin(), copy.end());
    copy.erase(last_unique, copy.end());
    GUDHI_CHECK_code(
      for (Vertex_handle v : copy)
        GUDHI_CHECK(v != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    )
    // Update dimension if needed. We could wait to see if the insertion succeeds, but I doubt there is much to gain.
    dimension_ = (std::max)(dimension_, static_cast<int>(std::distance(copy.begin(), copy.end())) - 1);

    return rec_insert_simplex_and_subfaces_sorted(root(), copy.begin(), copy.end(), filtration);
  }